

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O0

Aig_Man_t * Saig_ManCreateIndMiter(Aig_Man_t *pAig,Vec_Vec_t *vCands)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t **pObjMap_00;
  Aig_Man_t *p;
  char *pcVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pMiter;
  Aig_Obj_t *pFan1;
  Aig_Obj_t *pFan0;
  Aig_Obj_t *pNode1;
  Aig_Obj_t *pNode0;
  Aig_Obj_t *pObjR;
  int local_60;
  int k;
  int f;
  int i;
  Aig_Obj_t **pObjMap;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Aig_Man_t *pFrames;
  Vec_Ptr_t *vNodes;
  int nFrames;
  Vec_Vec_t *vCands_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = Aig_ManObjNumMax(pAig);
  pObjMap_00 = (Aig_Obj_t **)calloc((long)(iVar1 * 2),8);
  iVar1 = Aig_ManObjNumMax(pAig);
  p = Aig_ManStart(iVar1 * 2);
  pcVar3 = Abc_UtilStrsav(pAig->pName);
  p->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(pAig->pSpec);
  p->pSpec = pcVar3;
  for (local_60 = 0; local_60 < 2; local_60 = local_60 + 1) {
    pAVar4 = Aig_ManConst1(pAig);
    pAVar5 = Aig_ManConst1(p);
    Aig_ObjSetFrames(pObjMap_00,2,pAVar4,local_60,pAVar5);
  }
  for (local_60 = 0; local_60 < 2; local_60 = local_60 + 1) {
    k = 0;
    while( true ) {
      iVar1 = Aig_ManCiNum(pAig);
      iVar2 = Aig_ManRegNum(pAig);
      if (iVar1 - iVar2 <= k) break;
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,k);
      pAVar5 = Aig_ObjCreateCi(p);
      Aig_ObjSetFrames(pObjMap_00,2,pAVar4,local_60,pAVar5);
      k = k + 1;
    }
  }
  iVar1 = Aig_ManCiNum(pAig);
  iVar2 = Aig_ManRegNum(pAig);
  for (k = iVar1 - iVar2; iVar1 = Vec_PtrSize(pAig->vCis), k < iVar1; k = k + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,k);
    pAVar5 = Aig_ObjCreateCi(p);
    Aig_ObjSetFrames(pObjMap_00,2,pAVar4,0,pAVar5);
  }
  for (local_60 = 0; local_60 < 2; local_60 = local_60 + 1) {
    for (k = 0; iVar1 = Vec_PtrSize(pAig->vObjs), k < iVar1; k = k + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,k);
      if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar4), iVar1 != 0)) {
        pAVar5 = Aig_ObjChild0Frames(pObjMap_00,2,pAVar4,local_60);
        pAVar6 = Aig_ObjChild1Frames(pObjMap_00,2,pAVar4,local_60);
        pAVar5 = Aig_And(p,pAVar5,pAVar6);
        Aig_ObjSetFrames(pObjMap_00,2,pAVar4,local_60,pAVar5);
      }
    }
    for (k = 0; iVar1 = Aig_ManRegNum(pAig), k < iVar1; k = k + 1) {
      pAVar4 = Aig_ManLi(pAig,k);
      pAVar5 = Aig_ManLo(pAig,k);
      pAVar4 = Aig_ObjChild0Frames(pObjMap_00,2,pAVar4,local_60);
      if (local_60 < 1) {
        Aig_ObjSetFrames(pObjMap_00,2,pAVar5,local_60 + 1,pAVar4);
      }
    }
  }
  for (k = 0; iVar1 = Vec_VecSize(vCands), k < iVar1; k = k + 1) {
    p_00 = Vec_VecEntry(vCands,k);
    for (pObjR._4_4_ = 0; iVar1 = Vec_PtrSize(p_00), pObjR._4_4_ < iVar1;
        pObjR._4_4_ = pObjR._4_4_ + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p_00,pObjR._4_4_);
      pAVar5 = Aig_Regular(pAVar6);
      iVar1 = Aig_ObjId(pAVar5);
      pAVar4 = pObjMap_00[iVar1 * 2];
      iVar1 = Aig_ObjId(pAVar5);
      pAVar5 = pObjMap_00[iVar1 * 2 + 1];
      iVar1 = Aig_IsComplement(pAVar6);
      pAVar4 = Aig_NotCond(pAVar4,iVar1);
      iVar1 = Aig_IsComplement(pAVar6);
      pAVar5 = Aig_NotCond(pAVar5,(uint)((iVar1 != 0 ^ 0xffU) & 1));
      pAVar4 = Aig_And(p,pAVar4,pAVar5);
      Aig_ObjCreateCo(p,pAVar4);
    }
  }
  Aig_ManCleanup(p);
  if (pObjMap_00 != (Aig_Obj_t **)0x0) {
    free(pObjMap_00);
  }
  return p;
}

Assistant:

Aig_Man_t * Saig_ManCreateIndMiter( Aig_Man_t * pAig, Vec_Vec_t * vCands )
{
    int nFrames = 2;
    Vec_Ptr_t * vNodes;
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pObjNew;
    Aig_Obj_t ** pObjMap;
    int i, f, k;

    // create mapping for the frames nodes
    pObjMap  = ABC_CALLOC( Aig_Obj_t *, nFrames * Aig_ManObjNumMax(pAig) );

    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(pAig) * nFrames );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // map constant nodes
    for ( f = 0; f < nFrames; f++ )
        Aig_ObjSetFrames( pObjMap, nFrames, Aig_ManConst1(pAig), f, Aig_ManConst1(pFrames) );
    // create PI nodes for the frames
    for ( f = 0; f < nFrames; f++ )
        Aig_ManForEachPiSeq( pAig, pObj, i )
            Aig_ObjSetFrames( pObjMap, nFrames, pObj, f, Aig_ObjCreateCi(pFrames) );
    // set initial state for the latches
    Aig_ManForEachLoSeq( pAig, pObj, i )
        Aig_ObjSetFrames( pObjMap, nFrames, pObj, 0, Aig_ObjCreateCi(pFrames) );

    // add timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // add internal nodes of this frame
        Aig_ManForEachNode( pAig, pObj, i )
        {
            pObjNew = Aig_And( pFrames, Aig_ObjChild0Frames(pObjMap,nFrames,pObj,f), Aig_ObjChild1Frames(pObjMap,nFrames,pObj,f) );
            Aig_ObjSetFrames( pObjMap, nFrames, pObj, f, pObjNew );
        }
        // set the latch inputs and copy them into the latch outputs of the next frame
        Aig_ManForEachLiLoSeq( pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Aig_ObjChild0Frames(pObjMap,nFrames,pObjLi,f);
            if ( f < nFrames - 1 )
                Aig_ObjSetFrames( pObjMap, nFrames, pObjLo, f+1, pObjNew );
        }
    }

    // go through the candidates
    Vec_VecForEachLevel( vCands, vNodes, i )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, k )
        {
            Aig_Obj_t * pObjR  = Aig_Regular(pObj);
            Aig_Obj_t * pNode0 = pObjMap[nFrames*Aig_ObjId(pObjR)+0];
            Aig_Obj_t * pNode1 = pObjMap[nFrames*Aig_ObjId(pObjR)+1];
            Aig_Obj_t * pFan0  = Aig_NotCond( pNode0,  Aig_IsComplement(pObj) );
            Aig_Obj_t * pFan1  = Aig_NotCond( pNode1, !Aig_IsComplement(pObj) );
            Aig_Obj_t * pMiter = Aig_And( pFrames, pFan0, pFan1 );
            Aig_ObjCreateCo( pFrames, pMiter );
        }
    }
    Aig_ManCleanup( pFrames );
    ABC_FREE( pObjMap );

//Aig_ManShow( pAig, 0, NULL );
//Aig_ManShow( pFrames, 0, NULL );
    return pFrames;
}